

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O2

void __thiscall Highs::Highs(Highs *this)

{
  this->_vptr_Highs = (_func_int **)&PTR__Highs_004328a0;
  (this->solution_).value_valid = false;
  (this->solution_).dual_valid = false;
  (this->solution_).col_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->solution_).col_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->solution_).col_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->solution_).col_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->solution_).col_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->solution_).col_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->solution_).row_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->solution_).row_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->solution_).row_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->solution_).row_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->solution_).row_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->solution_).row_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  HighsBasis::HighsBasis(&this->basis_);
  (this->icrash_info_).x_values.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->icrash_info_).x_values.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->icrash_info_).details.
  super__Vector_base<ICrashIterationDetails,_std::allocator<ICrashIterationDetails>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->icrash_info_).x_values.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->icrash_info_).details.
  super__Vector_base<ICrashIterationDetails,_std::allocator<ICrashIterationDetails>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->icrash_info_).details.
  super__Vector_base<ICrashIterationDetails,_std::allocator<ICrashIterationDetails>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  HighsModel::HighsModel(&this->model_);
  (this->multi_linear_objective_).
  super__Vector_base<HighsLinearObjective,_std::allocator<HighsLinearObjective>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->multi_linear_objective_).
  super__Vector_base<HighsLinearObjective,_std::allocator<HighsLinearObjective>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->multi_linear_objective_).
  super__Vector_base<HighsLinearObjective,_std::allocator<HighsLinearObjective>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  HighsModel::HighsModel(&this->presolved_model_);
  HighsTimer::HighsTimer(&this->timer_);
  (this->callback_).active.super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  *(uint *)((long)&(this->callback_).active.super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_finish.super__Bit_iterator_base + 8) = 0;
  (this->callback_).active.super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
  *(undefined8 *)&(this->callback_).user_callback.super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->callback_).user_callback.super__Function_base._M_functor + 8) = 0;
  (this->callback_).user_callback.super__Function_base._M_manager = (_Manager_type)0x0;
  (this->callback_).user_callback._M_invoker = (_Invoker_type)0x0;
  (this->callback_).c_callback = (HighsCCallbackType)0x0;
  (this->callback_).user_callback_data = (void *)0x0;
  *(undefined8 *)((long)&(this->callback_).user_callback_data + 4) = 0;
  *(undefined8 *)
   ((long)&(this->callback_).active.super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_start.super__Bit_iterator_base + 4) = 0;
  HighsOptions::HighsOptions(&this->options_);
  HighsInfo::HighsInfo(&this->info_);
  (this->ranging_).valid = false;
  memset(&(this->ranging_).col_cost_up,0,0x241);
  memset(&(this->iis_).strategy_,0,0x94);
  this->model_presolve_status_ = kNotPresolved;
  this->model_status_ = kMin;
  (this->standard_form_cost_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->standard_form_cost_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->standard_form_cost_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->standard_form_rhs_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->standard_form_rhs_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->standard_form_rhs_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  HighsSparseMatrix::HighsSparseMatrix(&this->standard_form_matrix_);
  HEkk::HEkk(&this->ekk_instance_);
  *(undefined8 *)
   ((long)&(this->presolve_log_).rule.
           super__Vector_base<HighsPresolveRuleLog,_std::allocator<HighsPresolveRuleLog>_>._M_impl.
           super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->presolve_log_).rule.
           super__Vector_base<HighsPresolveRuleLog,_std::allocator<HighsPresolveRuleLog>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 4) = 0;
  (this->presolve_log_).rule.
  super__Vector_base<HighsPresolveRuleLog,_std::allocator<HighsPresolveRuleLog>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->presolve_log_).rule.
  super__Vector_base<HighsPresolveRuleLog,_std::allocator<HighsPresolveRuleLog>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  this->called_return_from_run = true;
  this->debug_run_call_num_ = 0;
  this->written_log_header_ = false;
  PresolveComponent::PresolveComponent(&this->presolve_);
  return;
}

Assistant:

Highs::Highs() {}